

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int binstrr(bstring b1,int pos,bstring b2)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  uchar *puVar4;
  uint uVar5;
  long lVar6;
  
  iVar3 = -1;
  if (((((b1 != (bstring)0x0) && (puVar4 = b1->data, puVar4 != (uchar *)0x0)) &&
       (uVar5 = b1->slen, b2 != (bstring)0x0 && -1 < (int)uVar5)) &&
      ((puVar2 = b2->data, puVar2 != (uchar *)0x0 && (uVar1 = b2->slen, -1 < (int)uVar1)))) &&
     (iVar3 = pos, uVar5 != pos || uVar1 != 0)) {
    iVar3 = -1;
    if ((uint)pos <= uVar5) {
      iVar3 = pos;
    }
    if (((uint)pos <= uVar5 && uVar1 != 0) &&
       (iVar3 = 0, (pos != 0 || puVar4 != puVar2) || uVar5 < uVar1)) {
      uVar5 = uVar5 - uVar1;
      iVar3 = -1;
      if (-1 < (int)uVar5) {
        if (uVar5 < (uint)pos) {
          pos = uVar5;
        }
        puVar4 = puVar4 + pos;
        while( true ) {
          lVar6 = 0;
          while (puVar2[lVar6] == puVar4[lVar6]) {
            lVar6 = lVar6 + 1;
            if ((int)uVar1 <= (int)lVar6) {
              return pos;
            }
          }
          if (pos < 1) break;
          pos = pos - 1;
          puVar4 = puVar4 + -1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int binstrr (const bstring b1, int pos, const bstring b2) {
int j, i, l;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos && b2->slen == 0) return pos;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	/* Obvious alias case */
	if (b1->data == b2->data && pos == 0 && b2->slen <= b1->slen) return 0;

	i = pos;
	if ((l = b1->slen - b2->slen) < 0) return BSTR_ERR;

	/* If no space to find such a string then snap back */
	if (l + 1 <= i) i = l;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	l  = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j]) {
			j ++;
			if (j >= l) return i;
		} else {
			i --;
			if (i < 0) break;
			j=0;
		}
	}

	return BSTR_ERR;
}